

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O1

void __thiscall
Memory::InlineCacheAllocator::ClearCacheIfHasDeadWeakRefs
          (InlineCacheAllocator *this,Recycler *recycler,CacheLayout *cache)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  intptr_t *curWeakRefPtr;
  CacheLayout *pCVar4;
  
  pCVar4 = cache;
  do {
    uVar1 = pCVar4->weakRefs[0];
    bVar2 = false;
    if ((uVar1 & 0xb) == 0 && uVar1 != 0) {
      bVar3 = HeapBlockMap64::IsMarked(&recycler->heapBlockMap,(void *)(uVar1 & 0xfffffffffffffff0))
      ;
      bVar2 = false;
      if (!bVar3) {
        cache->weakRefs[0] = 0;
        cache->weakRefs[1] = 0;
        cache->weakRefs[2] = 0;
        bVar2 = true;
      }
    }
  } while ((!bVar2) && (pCVar4 = (CacheLayout *)(pCVar4->weakRefs + 1), pCVar4 < &cache->strongRef))
  ;
  return;
}

Assistant:

void InlineCacheAllocator::ClearCacheIfHasDeadWeakRefs(Recycler* recycler, CacheLayout* cache)
{
    for (intptr_t* curWeakRefPtr = cache->weakRefs; curWeakRefPtr < &cache->strongRef; curWeakRefPtr++)
    {
        intptr_t curWeakRef = *curWeakRefPtr;

        if (curWeakRef == 0)
        {
            continue;
        }

        curWeakRef &= ~(intptr_t)InlineCacheAuxSlotTypeTag;

        if ((curWeakRef & (HeapConstants::ObjectGranularity - 1)) != 0)
        {
            continue;
        }

        if (!recycler->IsObjectMarked((void*)curWeakRef))
        {
            cache->weakRefs[0] = 0;
            cache->weakRefs[1] = 0;
            cache->weakRefs[2] = 0;
            break;
        }
    }
}